

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc stbi__get8(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi__context *s_local;
  
  if (s->img_buffer < s->img_buffer_end) {
    psVar1 = s->img_buffer;
    s->img_buffer = psVar1 + 1;
    s_local._7_1_ = *psVar1;
  }
  else if (s->read_from_callbacks == 0) {
    s_local._7_1_ = '\0';
  }
  else {
    stbi__refill_buffer(s);
    psVar1 = s->img_buffer;
    s->img_buffer = psVar1 + 1;
    s_local._7_1_ = *psVar1;
  }
  return s_local._7_1_;
}

Assistant:

stbi_inline static stbi_uc stbi__get8(stbi__context *s) {
  if (s->img_buffer < s->img_buffer_end)
    return *s->img_buffer++;
  if (s->read_from_callbacks) {
    stbi__refill_buffer(s);
    return *s->img_buffer++;
  }
  return 0;
}